

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * cfd::js::api::json::JsonMappingApi::EstimateFee
                   (string *__return_storage_ptr__,string *request_message)

{
  code *local_48 [2];
  code *local_38;
  code *local_30;
  undefined1 local_28 [24];
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionJsonApi::EstimateFee;
  local_10 = std::
             _Function_handler<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*),_void_(*)(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*),_void_(*)(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
       ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = ElementsTransactionJsonApi::EstimateFee;
  local_30 = std::
             _Function_handler<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*),_void_(*)(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*),_void_(*)(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
             ::_M_manager;
  ExecuteElementsCheckDirectApi<cfd::js::api::json::EstimateFeeRequest,cfd::js::api::json::EstimateFeeResponse>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,
             (function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
              *)local_48,
             (function<void_(cfd::js::api::json::EstimateFeeRequest_*,_cfd::js::api::json::EstimateFeeResponse_*)>
              *)ElementsTransactionJsonApi::EstimateFee);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::EstimateFee(const std::string &request_message) {
  return ExecuteElementsCheckDirectApi<
      api::json::EstimateFeeRequest, api::json::EstimateFeeResponse>(
      request_message, TransactionJsonApi::EstimateFee,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionJsonApi::EstimateFee);
#else
      TransactionJsonApi::EstimateFee);
#endif
}